

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

int __thiscall Epanet::Project::openOutput(Project *this,char *fname)

{
  size_t sVar1;
  ENerror *e;
  string local_40 [32];
  char *local_20;
  char *fname_local;
  Project *this_local;
  
  if ((this->networkEmpty & 1U) == 0) {
    local_20 = fname;
    fname_local = (char *)this;
    OutputFile::close(&this->outputFile,(int)fname);
    this->outputFileOpened = false;
    std::__cxx11::string::operator=((string *)&this->outFileName,local_20);
    sVar1 = strlen(local_20);
    if (sVar1 == 0) {
      std::__cxx11::string::operator=((string *)&this->outFileName,(string *)&this->tmpFileName);
    }
    std::__cxx11::string::string(local_40,(string *)&this->outFileName);
    OutputFile::open(&this->outputFile,(char *)local_40,(int)this);
    std::__cxx11::string::~string(local_40);
    this->outputFileOpened = true;
  }
  return 0;
}

Assistant:

int Project::openOutput(const char* fname)
    {
        //... close an already opened output file
        if ( networkEmpty ) return 0;
        outputFile.close();
        outputFileOpened = false;

        // ... save the name of the output file
        outFileName = fname;
        if ( strlen(fname) == 0 ) outFileName = tmpFileName;

        // ... open the file
        try
        {
            outputFile.open(outFileName, &network);
            outputFileOpened = true;
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }